

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::RoundFun::GetFunctions(void)

{
  LogicalType LVar1;
  char cVar2;
  InternalException *this;
  code *pcVar3;
  long lVar4;
  code *pcVar5;
  ScalarFunctionSet *in_RDI;
  pointer pLVar6;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  scalar_function_t round_func;
  scalar_function_t round_prec_func;
  allocator_type local_401;
  ScalarFunctionSet *local_400;
  undefined **local_3f8;
  ScalarFunctionSet *local_3f0;
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [8];
  LogicalType local_3d0 [24];
  _Any_data local_3b8;
  code *local_3a8;
  undefined8 uStack_3a0;
  _Any_data local_398;
  code *local_388;
  undefined8 uStack_380;
  _Any_data *local_378;
  _Any_data *local_370;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_368;
  _Any_data local_350;
  code *local_340;
  _Any_data local_330;
  code *local_320;
  LogicalType local_310 [24];
  LogicalType local_2f8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2e0;
  LogicalType local_2c8 [24];
  LogicalType local_2b0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_298;
  undefined **local_280 [22];
  _Any_data _Stack_1d0;
  _Manager_type local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  undefined **local_158 [22];
  _Any_data local_a8;
  _Manager_type local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_400 = in_RDI;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Numeric();
  if (local_368.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_368.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_3f0 = local_400 + 0x20;
    local_370 = (_Any_data *)(local_158 + 0x16);
    local_378 = (_Any_data *)(local_280 + 0x16);
    local_3f8 = &PTR__ScalarFunction_008984e0;
    pLVar6 = local_368.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_388 = (code *)0x0;
      uStack_380 = 0;
      local_398._M_unused._M_object = (void *)0x0;
      local_398._8_8_ = 0;
      local_3a8 = (code *)0x0;
      uStack_3a0 = 0;
      local_3b8._M_unused._M_object = (void *)0x0;
      local_3b8._8_8_ = 0;
      cVar2 = duckdb::LogicalType::IsIntegral();
      if (cVar2 == '\0') {
        LVar1 = *pLVar6;
        pcVar3 = BindDecimalRoundPrecision;
        pcVar5 = BindGenericRoundFunctionDecimal<duckdb::RoundDecimalOperator>;
        if (LVar1 != (LogicalType)0x15) {
          pcVar5 = ScalarFunction::UnaryFunction<float,float,duckdb::RoundOperator>;
          pcVar3 = ScalarFunction::BinaryFunction<float,int,float,duckdb::RoundOperatorPrecision>;
          if (LVar1 != (LogicalType)0x16) {
            if (LVar1 != (LogicalType)0x17) {
              this = (InternalException *)__cxa_allocate_exception(0x10);
              local_3e8[0] = local_3d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3e8,"Unimplemented numeric type for function \"floor\"","")
              ;
              duckdb::InternalException::InternalException(this,(string *)local_3e8);
              __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
            }
            pcVar5 = ScalarFunction::UnaryFunction<double,double,duckdb::RoundOperator>;
            pcVar3 = ScalarFunction::
                     BinaryFunction<double,int,double,duckdb::RoundOperatorPrecision>;
          }
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_3b8._M_pod_data,pcVar5);
          std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
          operator=((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                    local_398._M_pod_data,pcVar3);
          pcVar3 = (code *)0x0;
          pcVar5 = (code *)0x0;
        }
        duckdb::LogicalType::LogicalType((LogicalType *)local_3e8,pLVar6);
        __l._M_len = 1;
        __l._M_array = (LogicalType *)local_3e8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_2e0,__l,&local_401);
        duckdb::LogicalType::LogicalType(local_2f8,pLVar6);
        std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_330,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_3b8);
        duckdb::LogicalType::LogicalType(local_2b0,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_158,&local_2e0,local_2f8,&local_330,pcVar5,0,0,0,
                   local_2b0,0,0,0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                   local_3f0,(ScalarFunction *)local_158);
        local_158[0] = local_3f8;
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        if (local_98 != (_Manager_type)0x0) {
          (*local_98)(local_370,local_370,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_158);
        duckdb::LogicalType::~LogicalType(local_2b0);
        if (local_320 != (code *)0x0) {
          (*local_320)(&local_330,&local_330,__destroy_functor);
        }
        duckdb::LogicalType::~LogicalType(local_2f8);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2e0);
        duckdb::LogicalType::~LogicalType((LogicalType *)local_3e8);
        duckdb::LogicalType::LogicalType((LogicalType *)local_3e8,pLVar6);
        duckdb::LogicalType::LogicalType(local_3d0,INTEGER);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_3e8;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_298,__l_00,&local_401);
        duckdb::LogicalType::LogicalType(local_310,pLVar6);
        std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
        function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_350,
                 (function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  *)&local_398);
        duckdb::LogicalType::LogicalType(local_2c8,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  ((ScalarFunction *)local_280,&local_298,local_310,&local_350,pcVar3,0,0,0,
                   local_2c8,0,0,0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>
                  ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                   local_3f0,(ScalarFunction *)local_280);
        local_280[0] = local_3f8;
        if (local_160._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_160._M_pi);
        }
        if (local_1c0 != (_Manager_type)0x0) {
          (*local_1c0)(local_378,local_378,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_280);
        duckdb::LogicalType::~LogicalType(local_2c8);
        if (local_340 != (code *)0x0) {
          (*local_340)(&local_350,&local_350,__destroy_functor);
        }
        duckdb::LogicalType::~LogicalType(local_310);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_298);
        lVar4 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)((long)local_3e8 + lVar4));
          lVar4 = lVar4 + -0x18;
        } while (lVar4 != -0x18);
      }
      if (local_3a8 != (code *)0x0) {
        (*local_3a8)(&local_3b8,&local_3b8,__destroy_functor);
      }
      if (local_388 != (code *)0x0) {
        (*local_388)(&local_398,&local_398,__destroy_functor);
      }
      pLVar6 = pLVar6 + 0x18;
    } while (pLVar6 != local_368.
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_368);
  return local_400;
}

Assistant:

ScalarFunctionSet RoundFun::GetFunctions() {
	ScalarFunctionSet round;
	for (auto &type : LogicalType::Numeric()) {
		scalar_function_t round_prec_func = nullptr;
		scalar_function_t round_func = nullptr;
		bind_scalar_function_t bind_func = nullptr;
		bind_scalar_function_t bind_prec_func = nullptr;
		if (type.IsIntegral()) {
			// no round for integral numbers
			continue;
		}
		switch (type.id()) {
		case LogicalTypeId::FLOAT:
			round_func = ScalarFunction::UnaryFunction<float, float, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<float, int32_t, float, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DOUBLE:
			round_func = ScalarFunction::UnaryFunction<double, double, RoundOperator>;
			round_prec_func = ScalarFunction::BinaryFunction<double, int32_t, double, RoundOperatorPrecision>;
			break;
		case LogicalTypeId::DECIMAL:
			bind_func = BindGenericRoundFunctionDecimal<RoundDecimalOperator>;
			bind_prec_func = BindDecimalRoundPrecision;
			break;
		default:
			throw InternalException("Unimplemented numeric type for function \"floor\"");
		}
		round.AddFunction(ScalarFunction({type}, type, round_func, bind_func));
		round.AddFunction(ScalarFunction({type, LogicalType::INTEGER}, type, round_prec_func, bind_prec_func));
	}
	return round;
}